

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_is_my_stream_id(nghttp2_session *session,int32_t stream_id)

{
  int rem;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (stream_id == 0) {
    session_local._4_4_ = 0;
  }
  else if (session->server == '\0') {
    session_local._4_4_ = (uint)((stream_id & 1U) == 1);
  }
  else {
    session_local._4_4_ = (uint)((stream_id & 1U) == 0);
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_is_my_stream_id(nghttp2_session *session,
                                    int32_t stream_id) {
  int rem;
  if (stream_id == 0) {
    return 0;
  }
  rem = stream_id & 0x1;
  if (session->server) {
    return rem == 0;
  }
  return rem == 1;
}